

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QtCbor::Element>::reserve(QList<QtCbor::Element> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *data;
  QArrayData *pQVar3;
  Element *__dest;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= (pDVar2->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 4))) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_002ecd2a;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_002ecd2a;
    }
  }
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  __dest = (Element *)QArrayData::allocate(&local_30,0x10,0x10,asize,KeepSize);
  pQVar3 = local_30;
  lVar4 = (this->d).size;
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    memcpy(__dest,(this->d).ptr,lVar4 << 4);
  }
  if (pQVar3 != (QArrayData *)0x0) {
    *(byte *)&(pQVar3->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar3->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  data = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)pQVar3;
  (this->d).ptr = __dest;
  (this->d).size = lVar4;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,0x10,0x10);
    }
  }
LAB_002ecd2a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}